

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O3

Vec_Int_t * Gia_ShowMapAdds(Gia_Man_t *p,Vec_Int_t *vAdds,int fFadds,Vec_Int_t *vBold)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  void *__s;
  Vec_Int_t *pVVar8;
  int *__s_00;
  int iVar9;
  long lVar10;
  size_t __size;
  int iVar11;
  uint uVar12;
  
  uVar3 = p->nObjs;
  iVar11 = (((int)uVar3 >> 5) + 1) - (uint)((uVar3 & 0x1f) == 0);
  if (iVar11 == 0) {
    __size = 0;
    __s = (void *)0x0;
  }
  else {
    __size = (long)iVar11 << 2;
    __s = malloc(__size);
  }
  memset(__s,0,__size);
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  uVar12 = 0x10;
  if (0xe < uVar3 - 1) {
    uVar12 = uVar3;
  }
  pVVar8->nCap = uVar12;
  if (uVar12 == 0) {
    pVVar8->pArray = (int *)0x0;
    pVVar8->nSize = uVar3;
  }
  else {
    __s_00 = (int *)malloc((long)(int)uVar12 << 2);
    pVVar8->pArray = __s_00;
    pVVar8->nSize = uVar3;
    if (__s_00 != (int *)0x0) {
      memset(__s_00,0xff,(long)(int)uVar3 << 2);
      goto LAB_007bc6ac;
    }
  }
  __s_00 = (int *)0x0;
LAB_007bc6ac:
  uVar12 = iVar11 * 0x20;
  if ((vBold != (Vec_Int_t *)0x0) && (iVar11 = vBold->nSize, 0 < (long)iVar11)) {
    piVar7 = vBold->pArray;
    lVar10 = 0;
    do {
      uVar4 = piVar7[lVar10];
      if (((int)uVar4 < 0) || ((int)uVar12 <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      puVar2 = (uint *)((long)__s + (ulong)(uVar4 >> 5) * 4);
      *puVar2 = *puVar2 | 1 << ((byte)uVar4 & 0x1f);
      lVar10 = lVar10 + 1;
    } while (iVar11 != lVar10);
  }
  uVar4 = vAdds->nSize;
  if (0 < (int)uVar4) {
    iVar11 = 0;
    iVar9 = 0;
    do {
      if (fFadds == 0) {
LAB_007bc722:
        if ((int)uVar4 <= (int)(iVar11 + 3U)) {
LAB_007bc7de:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar7 = vAdds->pArray;
        uVar5 = piVar7[iVar11 + 3U];
        if (((int)uVar5 < 0) || ((int)uVar12 <= (int)uVar5)) {
LAB_007bc7fd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if ((*(uint *)((long)__s + (ulong)(uVar5 >> 5) * 4) >> (uVar5 & 0x1f) & 1) == 0) {
          uVar1 = iVar11 + 4;
          if (uVar4 <= uVar1) goto LAB_007bc7de;
          uVar6 = piVar7[uVar1];
          if (((int)uVar6 < 0) || (uVar12 <= uVar6)) goto LAB_007bc7fd;
          if ((*(uint *)((long)__s + (ulong)(uVar6 >> 5) * 4) >> (uVar6 & 0x1f) & 1) == 0) {
            if ((int)uVar3 <= (int)uVar5) {
LAB_007bc83b:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            __s_00[uVar5] = iVar9;
            uVar5 = piVar7[uVar1];
            if (((long)(int)uVar5 < 0) || (uVar3 <= uVar5)) goto LAB_007bc83b;
            __s_00[(int)uVar5] = iVar9;
          }
        }
      }
      else {
        if ((int)uVar4 <= (int)(iVar11 + 2U)) goto LAB_007bc7de;
        if (vAdds->pArray[iVar11 + 2U] != 0) goto LAB_007bc722;
      }
      iVar9 = iVar9 + 1;
      iVar11 = iVar11 + 6;
    } while (iVar11 < (int)uVar4);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return pVVar8;
}

Assistant:

Vec_Int_t * Gia_ShowMapAdds( Gia_Man_t * p, Vec_Int_t * vAdds, int fFadds, Vec_Int_t * vBold )
{
    Vec_Bit_t * vIsBold = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vMapAdds = Vec_IntStartFull( Gia_ManObjNum(p) ); int i, Entry;
    if ( vBold )
        Vec_IntForEachEntry( vBold, Entry, i )
            Vec_BitWriteEntry( vIsBold, Entry, 1 );
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( fFadds && Vec_IntEntry(vAdds, 6*i+2) == 0 )
            continue;
        if ( Vec_BitEntry(vIsBold, Vec_IntEntry(vAdds, 6*i+3)) || Vec_BitEntry(vIsBold, Vec_IntEntry(vAdds, 6*i+4)) )
            continue;
        Vec_IntWriteEntry( vMapAdds, Vec_IntEntry(vAdds, 6*i+3), i );
        Vec_IntWriteEntry( vMapAdds, Vec_IntEntry(vAdds, 6*i+4), i );
    }
    Vec_BitFree( vIsBold );
    return vMapAdds;
}